

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

int bfgs_min_naive(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                  double fsval,double maxstep,int MAXITER,double eps,double *xf)

{
  size_t __size;
  double dVar1;
  double gtol;
  double eps2;
  int iVar2;
  int retval;
  int iVar3;
  long lVar4;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *A;
  double *L;
  double *f_00;
  ulong uVar5;
  double *pdVar6;
  char *__format;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double temp;
  int local_34;
  
  lVar4 = (long)N;
  __size = lVar4 * 8;
  f = (double *)malloc(__size);
  array = (double *)malloc(__size);
  xi_00 = (double *)malloc(__size);
  x = (double *)malloc(__size);
  A = (double *)malloc(__size * lVar4);
  L = (double *)malloc(__size * lVar4);
  f_00 = (double *)malloc(__size);
  gtol = pow(eps,0.3333333333333333);
  if (eps < 0.0) {
    eps2 = sqrt(eps);
  }
  else {
    eps2 = SQRT(eps);
  }
  uVar5 = 0;
  uVar8 = 0;
  if (0 < N) {
    uVar8 = (ulong)(uint)N;
  }
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    xi[uVar5] = dx[uVar5] * xi[uVar5];
    dx[uVar5] = 1.0 / dx[uVar5];
  }
  dVar9 = (*funcpt->funcpt)(xi,N,funcpt->params);
  dVar10 = ABS(dVar9);
  local_34 = 0;
  if (1.79769313486232e+308 <= dVar10) {
    local_34 = 0xf;
    printf("Program Exiting as the function value exceeds the maximum double value");
  }
  if (NAN(dVar9)) {
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
  }
  iVar2 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,f);
  if (iVar2 == 0xf) {
    local_34 = 0xf;
  }
  dVar9 = 0.0;
  if (maxstep <= 0.0) {
    dVar11 = 0.0;
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = dx[uVar5];
      dVar11 = dVar11 + dVar1 * dVar1;
      dVar9 = dVar9 + dVar1 * xi[uVar5] * dVar1 * xi[uVar5];
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    if (dVar11 <= dVar9) {
      maxstep = dVar9 * 1000.0;
    }
    else {
      maxstep = dVar11 * 1000.0;
    }
  }
  dVar9 = dVar10;
  if (dVar10 <= ABS(fsval)) {
    dVar9 = ABS(fsval);
  }
  for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    dVar11 = ABS(xi[uVar5]);
    if (ABS(xi[uVar5]) <= 1.0 / ABS(dx[uVar5])) {
      dVar11 = 1.0 / ABS(dx[uVar5]);
    }
    array[uVar5] = (ABS(f[uVar5]) * dVar11) / dVar9;
  }
  dVar9 = array_max_abs(array,N);
  if (dVar9 <= gtol * 0.001) {
    iVar2 = 1;
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      xf[uVar5] = xi[uVar5];
    }
  }
  else {
    if (dVar10 <= fsval) {
      dVar10 = fsval;
    }
    pdVar6 = A;
    for (uVar5 = 0; uVar5 != uVar8; uVar5 = uVar5 + 1) {
      for (uVar7 = 0; (uint)N != uVar7; uVar7 = uVar7 + 1) {
        if (uVar5 == uVar7) {
          A[uVar5 + uVar5 * lVar4] = dVar10 * dx[uVar5] * dx[uVar5];
        }
        else {
          pdVar6[uVar7] = 0.0;
        }
      }
      pdVar6 = pdVar6 + lVar4;
    }
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      xi_00[uVar5] = xi[uVar5];
    }
    iVar2 = 0;
    while ((local_34 == 0 && (iVar2 < MAXITER))) {
      modelhess(A,N,dx,eps,L);
      scale(f,1,N,-1.0);
      linsolve_lower(L,N,f,x);
      scale(f,1,N,-1.0);
      retval = lnsrch(funcpt,xi_00,f,x,N,dx,maxstep,gtol * gtol,xf);
      dVar10 = (*funcpt->funcpt)(xf,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar10)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0012ab43:
        printf(__format);
LAB_0012ab5c:
        iVar2 = 0xf;
        goto LAB_0012ab5f;
      }
      if (NAN(dVar10)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_0012ab43;
      }
      iVar3 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,f_00);
      if (iVar3 == 0xf) goto LAB_0012ab5c;
      iVar2 = iVar2 + 1;
      local_34 = stopcheck(dVar10,N,xi_00,xf,f_00,dx,fsval,gtol,gtol * gtol,retval);
      bfgs_naive(A,N,eps,xi_00,xf,f,f_00);
      for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        xi_00[uVar5] = xf[uVar5];
        f[uVar5] = f_00[uVar5];
      }
    }
    iVar2 = (uint)(MAXITER <= iVar2) << 2;
    if (local_34 != 0) {
      iVar2 = local_34;
    }
LAB_0012ab5f:
    free(f);
    free(A);
    free(array);
    free(xi_00);
    free(L);
    free(x);
    free(f_00);
  }
  return iVar2;
}

Assistant:

int bfgs_min_naive(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval, double maxstep, int MAXITER,
		double eps,double *xf)  {
	int rcode,iter,gfdcode;
	int i,siter,retval;
	double gtol,stol,dt1,dt2;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*hess,*scheck,*xc,*L,*step,*jacf;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 
	 */ 
	
	rcode = 0;
	iter = 0;
	siter = MAXITER;
	gtol = pow(eps,1.0/3.0);
	
	stol = gtol * gtol;
	eps2 = sqrt(eps);
	gfdcode = 0;
	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt,xi,N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	
	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	
	
	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}
	
	//printf("dt1 dt2 %g \n", maxstep);

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
		return rcode;
	}
	
	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_naive(hess,N,fx,fsval,dx);
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && iter < siter) {
		iter++;
		modelhess(hess,N,dx,eps,L);
		scale(jac,1,N,-1.0);
		//mdisplay(hess,N,N);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);
		//retval = lnsrchmod(funcpt,xc,jac,step,N,dx,maxstep,stol,xf,jacf); 
		retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		
		//retval = swolfe(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		
		fxf = FUNCPT_EVAL(funcpt,xf,N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}
		//printf("%d %g \n",iter,fxf);
		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jacf);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		rcode = stopcheck(fxf,N,xc,xf,jacf,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,hess);
		bfgs_naive(hess,N,eps,xc,xf,jac,jacf);
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			jac[i] = jacf[i];
		}
	}
	
	if (rcode == 0 && iter >= siter) {
		rcode = 4;
	}
	/*
	for(i = 0; i < N;++i) {
		xf[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	*/
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}